

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O2

PSNodeJoin * __thiscall
dg::pta::LLVMPointerGraphBuilder::createJoinNode
          (LLVMPointerGraphBuilder *this,CallInst *CInst,PSNode *callNode)

{
  PSNodeJoin *pPVar1;
  PSNodeJoin *joinNode;
  PSNodeJoin *local_28;
  
  pPVar1 = (PSNodeJoin *)PointerGraph::create<(dg::pta::PSNodeType)14>((PointerGraph *)this);
  local_28 = (PSNodeJoin *)0x0;
  if ((pPVar1->super_PSNode).type == JOIN) {
    local_28 = pPVar1;
  }
  callNode->pairedNode = &local_28->super_PSNode;
  (local_28->super_PSNode).pairedNode = callNode;
  local_28->callInstruction = callNode;
  std::vector<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_>::push_back
            ((vector<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_> *)(this + 0x210)
             ,&local_28);
  addArgumentOperands(this,CInst,callNode);
  return local_28;
}

Assistant:

PSNodeJoin *LLVMPointerGraphBuilder::createJoinNode(const llvm::CallInst *CInst,
                                                    PSNode *callNode) {
    using namespace llvm;

    PSNodeJoin *joinNode = PSNodeJoin::get(PS.create<PSNodeType::JOIN>());
    callNode->setPairedNode(joinNode);
    joinNode->setPairedNode(callNode);

    joinNode->setCallInst(callNode);

    joinNodes.push_back(joinNode);
    addArgumentOperands(*CInst, *callNode);

    return joinNode;
}